

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::
SetPendingDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::PendingOperationalDataset_const&)
::$_0::~__0(__0 *this)

{
  ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)(this + 0x28));
  std::_Function_base::~_Function_base((_Function_base *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::SetPendingDataset(const PendingOperationalDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetPendingDataset(wait, aDataset);
    return pro.get_future().get();
}